

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QScore.h
# Opt level: O2

void __thiscall FASTQ::QScore::PrecomputeScores(QScore *this)

{
  int iVar1;
  int qx;
  long lVar2;
  long lVar3;
  double (*padVar4) [42];
  int (*paiVar5) [42];
  double dVar6;
  double dVar7;
  double p;
  double dVar8;
  
  padVar4 = this->mPosteriorErrorProbabilitiesForMismatch;
  paiVar5 = this->mPosteriorScoresForMismatch;
  for (lVar2 = 0; lVar2 != 0x2a; lVar2 = lVar2 + 1) {
    dVar6 = pow(10.0,(double)(int)lVar2 / -10.0);
    for (lVar3 = -0x2a; lVar3 != 0; lVar3 = lVar3 + 1) {
      dVar7 = pow(10.0,(double)((int)lVar3 + 0x2a) / -10.0);
      dVar8 = (dVar6 * 4.0 * dVar7) / 3.0;
      p = ((dVar6 * dVar7) / 3.0) / (((1.0 - dVar6) - dVar7) + dVar8);
      dVar7 = (double)(-(ulong)(dVar6 < dVar7) & (ulong)((1.0 - dVar7 / 3.0) * dVar6) |
                      ~-(ulong)(dVar6 < dVar7) & (ulong)((dVar6 / -3.0 + 1.0) * dVar7)) /
              ((dVar7 + dVar6) - dVar8);
      padVar4[-0x29][lVar3] = p;
      padVar4[1][lVar3] = dVar7;
      iVar1 = ProbabilityToScore(this,p);
      paiVar5[-0x29][lVar3] = iVar1;
      iVar1 = ProbabilityToScore(this,dVar7);
      paiVar5[1][lVar3] = iVar1;
    }
    padVar4 = padVar4 + 1;
    paiVar5 = paiVar5 + 1;
  }
  return;
}

Assistant:

void PrecomputeScores() {
    for( int qx = 0; qx <= Q_MAX_SCORE; qx++ ) {
      double px = ScoreToProbability( qx );

      for( int qy = 0; qy <= Q_MAX_SCORE; qy++ ) {
        double py = ScoreToProbability( qy );

        double pm = ( px * py / 3.0 ) /
                    ( 1.0 - px - py + 4.0 * px * py / 3.0 ); // (8) in paper

        double pmm;
        if( px < py ) {
          // px < py: merged base is X
          pmm = px * ( 1.0 - py / 3.0 ) /
                ( px + py - 4.0 * px * py / 3.0 ); // (9) in paper
        } else {
          // py < px: merged base is Y
          pmm = py * ( 1.0 - px / 3.0 ) /
                ( px + py - 4.0 * px * py / 3.0 ); // (9) in paper
        }

        mPosteriorErrorProbabilitiesForMatch[ qx ][ qy ]    = pm;
        mPosteriorErrorProbabilitiesForMismatch[ qx ][ qy ] = pmm;

        mPosteriorScoresForMatch[ qx ][ qy ]    = ProbabilityToScore( pm );
        mPosteriorScoresForMismatch[ qx ][ qy ] = ProbabilityToScore( pmm );
      }
    }
  }